

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::FieldDescriptorProto
          (FieldDescriptorProto *this,Arena *arena)

{
  Arena *in_RSI;
  FieldDescriptorProto *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  
  Message::Message(&in_RDI->super_Message);
  ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    *)&in_RDI->super_Message)->ptr_ = &PTR__FieldDescriptorProto_009674b0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_RDI,in_stack_ffffffffffffffb8);
  memset(&in_RDI->_has_bits_,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x516068);
  SharedCtor((FieldDescriptorProto *)in_RSI);
  RegisterArenaDtor(in_RDI,in_RSI);
  return;
}

Assistant:

FieldDescriptorProto::FieldDescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
  _internal_metadata_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FieldDescriptorProto)
}